

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void hashlin_shrink_step(tommy_hashlin *hashlin)

{
  long lVar1;
  tommy_hashlin_node *ptVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  tommy_count_t tVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  tommy_node_struct *ptVar11;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((hashlin->state != 2) && (hashlin->count < hashlin->bucket_max >> 3)) &&
     (6 < hashlin->bucket_bit)) {
    if (hashlin->state == 0) {
      uVar4 = hashlin->bucket_max >> 1;
      hashlin->low_max = uVar4;
      hashlin->low_mask = hashlin->bucket_mask >> 1;
      hashlin->split = uVar4;
    }
    hashlin->state = 2;
  }
  if (hashlin->state == 2) {
    tVar6 = hashlin->count;
    uVar9 = (ulong)(hashlin->low_max + hashlin->split);
    uVar7 = (ulong)(hashlin->split - 1);
    lVar10 = uVar7 * 8;
    do {
      if ((uint)uVar9 <= tVar6 << 3) goto LAB_00107e31;
      uVar5 = (uint)uVar7;
      hashlin->split = uVar5;
      uVar8 = (uint)uVar9 - 1;
      uVar9 = (ulong)uVar8;
      uVar8 = uVar8 | 1;
      uVar4 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      ptVar2 = hashlin->bucket[uVar4][uVar9];
      if (ptVar2 != (tommy_hashlin_node *)0x0) {
        uVar4 = 0x1f;
        if ((uVar5 | 1) != 0) {
          for (; (uVar5 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        lVar3 = *(long *)((long)hashlin->bucket[uVar4] + lVar10);
        if (lVar3 == 0) {
          ptVar11 = (tommy_node_struct *)((long)hashlin->bucket[uVar4] + lVar10);
        }
        else {
          ptVar11 = *(tommy_node_struct **)(lVar3 + 8);
          *(tommy_node_struct **)(lVar3 + 8) = ptVar2->prev;
          ptVar2->prev = ptVar11;
        }
        ptVar11->next = ptVar2;
      }
      lVar10 = lVar10 + -8;
      uVar7 = (ulong)(uVar5 - 1);
    } while (uVar5 != 0);
    uVar4 = hashlin->bucket_bit - 1;
    tVar6 = 1 << ((byte)uVar4 & 0x1f);
    hashlin->bucket_bit = uVar4;
    hashlin->bucket_max = tVar6;
    hashlin->bucket_mask = tVar6 - 1;
    free(hashlin->bucket[uVar4] + (1L << ((byte)uVar4 & 0x3f)));
    hashlin->state = 0;
    hashlin->low_max = hashlin->bucket_max;
    hashlin->low_mask = hashlin->bucket_mask;
    hashlin->split = 0;
  }
LAB_00107e31:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void hashlin_shrink_step(tommy_hashlin* hashlin)
{
	/* shrink if less than 12.5% full */
	if (hashlin->state != TOMMY_HASHLIN_STATE_SHRINK
		&& hashlin->count < hashlin->bucket_max / 8
	) {
		/* avoid to shrink the first bucket */
		if (hashlin->bucket_bit > TOMMY_HASHLIN_BIT) {
			/* if we are stable, setup a new shrink state */
			/* otherwise continue with the already setup grow one */
			/* but in backward direction */
			if (hashlin->state == TOMMY_HASHLIN_STATE_STABLE) {
				/* set the lower size */
				hashlin->low_max = hashlin->bucket_max / 2;
				hashlin->low_mask = hashlin->bucket_mask / 2;

				/* start from the half going backward */
				hashlin->split = hashlin->low_max;
			}

			/* start reallocation */
			hashlin->state = TOMMY_HASHLIN_STATE_SHRINK;
		}
	}

	/* if we are shrinking */
	if (hashlin->state == TOMMY_HASHLIN_STATE_SHRINK) {
		/* compute the split target required to finish the reallocation before the next resize */
		tommy_count_t split_target = 8 * hashlin->count;

		/* reallocate buckets until the split target */
		while (hashlin->split + hashlin->low_max > split_target) {
			tommy_hashlin_node** split[2];

			/* go backward position */
			--hashlin->split;

			/* get the low bucket */
			split[0] = tommy_hashlin_pos(hashlin, hashlin->split);

			/* get the high bucket */
			split[1] = tommy_hashlin_pos(hashlin, hashlin->split + hashlin->low_max);

			/* concat the high bucket into the low one */
			tommy_list_concat(split[0], split[1]);

			/* if we have finished, clean up and change the state */
			if (hashlin->split == 0) {
				tommy_hashlin_node** segment;

				/* shrink the hash size */
				--hashlin->bucket_bit;
				hashlin->bucket_max = 1 << hashlin->bucket_bit;
				hashlin->bucket_mask = hashlin->bucket_max - 1;

				/* free the last segment */
				segment = hashlin->bucket[hashlin->bucket_bit];
				tommy_free(&segment[((tommy_ptrdiff_t)1) << hashlin->bucket_bit]);

				/* go in stable mode */
				tommy_hashlin_stable(hashlin);
				break;
			}
		}
	}
}